

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPHelperTests.cpp
# Opt level: O2

void __thiscall
OpenMPHelperTest_OpenMPDisabled_Test::TestBody(OpenMPHelperTest_OpenMPDisabled_Test *this)

{
  undefined4 uVar1;
  char *pcVar2;
  AssertHelper local_30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertionResult gtest_ar;
  
  uVar1 = 1;
  local_30.data_._0_4_ = uVar1;
  local_28.ptr_._0_4_ = uVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","omp_get_max_threads()",(int *)&local_28,(int *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/threading/OpenMPHelperTests.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_28.ptr_._0_4_ = 0;
    local_30.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"0","omp_get_thread_num()",(int *)&local_28,(int *)&local_30);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_30.data_._0_4_ = uVar1;
      local_28.ptr_._0_4_ = uVar1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"1","omp_get_num_threads()",(int *)&local_28,(int *)&local_30
                );
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_28);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_30,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/threading/OpenMPHelperTests.cpp"
                   ,0x20,pcVar2);
        testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
        testing::internal::AssertHelper::~AssertHelper(&local_30);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_28);
      }
      goto LAB_001a76fc;
    }
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/threading/OpenMPHelperTests.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_28);
LAB_001a76fc:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(OpenMPHelperTest, OpenMPDisabled) {
    if (!useOpenMP()) {
        ASSERT_EQ(1, omp_get_max_threads());
        ASSERT_EQ(0, omp_get_thread_num());
        ASSERT_EQ(1, omp_get_num_threads());
    }
}